

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int mtar_read_data(mtar_t *tar,void *ptr,size_t size)

{
  size_t *psVar1;
  int iVar2;
  size_t sVar3;
  mtar_header_t h;
  mtar_header_t local_100;
  
  if (tar->remaining_data == 0) {
    iVar2 = mtar_read_header(tar,&local_100);
    if (iVar2 != 0) {
      return iVar2;
    }
    sVar3 = tar->pos + 0x200;
    iVar2 = (*tar->seek)(tar,sVar3);
    tar->pos = sVar3;
    if (iVar2 != 0) {
      return iVar2;
    }
    tar->remaining_data = local_100.size;
  }
  iVar2 = (*tar->read)(tar,ptr,size);
  tar->pos = tar->pos + size;
  if (iVar2 == 0) {
    iVar2 = 0;
    psVar1 = &tar->remaining_data;
    *psVar1 = *psVar1 - size;
    if (*psVar1 == 0) {
      sVar3 = tar->last_header;
      iVar2 = (*tar->seek)(tar,sVar3);
      tar->pos = sVar3;
    }
  }
  return iVar2;
}

Assistant:

int mtar_read_data(mtar_t *tar, void *ptr, size_t size) {
  int err;
  mtar_header_t h;
  /* If we have no remaining data then this is the first read, we get the size,
   * set the remaining data and seek to the beginning of the data */
  if (tar->remaining_data == 0) {
    /* Read header */
    err = mtar_read_header(tar, &h);
    if (err) {
      return err;
    }
    /* Seek past header and init remaining data */
    err = mtar_seek(tar, tar->pos + sizeof(mtar_raw_header_t));
    if (err) {
      return err;
    }
    tar->remaining_data = h.size;
  }
  /* Read data */
  err = mtar_tread(tar, ptr, size);
  if (err) {
    return err;
  }
  tar->remaining_data -= size;
  /* If there is no remaining data we've finished reading and seek back to the
   * header */
  if (tar->remaining_data == 0) {
    return mtar_seek(tar, tar->last_header);
  }
  return MTAR_ESUCCESS;
}